

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared.cpp
# Opt level: O1

int autoComplete(string *partial,
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *list,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *matches,int minimum)

{
  ulong uVar1;
  pointer pbVar2;
  size_t sVar3;
  ulong uVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *item;
  pointer __x;
  bool bVar8;
  bool bVar9;
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(matches,(matches->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start);
  uVar1 = partial->_M_string_length;
  uVar6 = (uint)uVar1;
  if (uVar6 != 0) {
    __x = (list->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
    pbVar2 = (list->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (__x != pbVar2) {
      do {
        sVar3 = partial->_M_string_length;
        uVar4 = __x->_M_string_length;
        if (sVar3 == uVar4) {
          if (sVar3 == 0) {
            bVar8 = true;
          }
          else {
            iVar7 = bcmp((partial->_M_dataplus)._M_p,(__x->_M_dataplus)._M_p,sVar3);
            bVar8 = iVar7 == 0;
          }
        }
        else {
          bVar8 = false;
        }
        if (bVar8) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_M_erase_at_end(matches,(matches->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start);
LAB_00115c2d:
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(matches,__x);
        }
        else {
          bVar5 = (uVar1 & 0xffffffff) <= uVar4;
          bVar9 = false;
          if (bVar5 && (uint)minimum <= uVar6) {
            std::__cxx11::string::substr((ulong)&local_50,(ulong)__x);
            sVar3 = partial->_M_string_length;
            bVar9 = false;
            if (sVar3 == local_48) {
              if (sVar3 == 0) {
                bVar9 = true;
              }
              else {
                iVar7 = bcmp((partial->_M_dataplus)._M_p,local_50,sVar3);
                bVar9 = iVar7 == 0;
              }
            }
          }
          if ((bVar5 && (uint)minimum <= uVar6) && (local_50 != local_40)) {
            operator_delete(local_50,local_40[0] + 1);
          }
          if (bVar9) goto LAB_00115c2d;
        }
        if (bVar8) {
          return 1;
        }
        __x = __x + 1;
      } while (__x != pbVar2);
    }
  }
  return (int)((ulong)((long)(matches->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(matches->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start) >> 5);
}

Assistant:

int autoComplete (
  const std::string& partial,
  const std::vector<std::string>& list,
  std::vector<std::string>& matches,
  int minimum/* = 1*/)
{
  matches.clear ();

  // Handle trivial case.
  unsigned int length = partial.length ();
  if (length)
  {
    for (auto& item : list)
    {
      // An exact match is a special case.  Assume there is only one exact match
      // and return immediately.
      if (partial == item)
      {
        matches.clear ();
        matches.push_back (item);
        return 1;
      }

      // Maintain a list of partial matches.
      else if (length >= (unsigned) minimum &&
               length <= item.length ()     &&
               partial == item.substr (0, length))
        matches.push_back (item);
    }
  }

  return matches.size ();
}